

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidGeometry(ON_Brep *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ON_Curve *pOVar8;
  ON_Surface *pOVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar15 = (ulong)(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar2 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  uVar3 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count
  ;
  uVar4 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  uVar5 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar6 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  uVar7 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  if (0 < (long)uVar15) {
    uVar16 = 0;
    do {
      pOVar8 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar16];
      if (pOVar8 != (ON_Curve *)0x0) {
        iVar11 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(pOVar8,text_log);
        if ((char)iVar11 == '\0') {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar13 = "ON_Brep.m_C2[%d] is invalid.\n";
          goto LAB_0040a4c5;
        }
        uVar12 = (*((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar16]->super_ON_Geometry).
                   super_ON_Object._vptr_ON_Object[0x18])();
        if (uVar12 != 2) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar13 = "ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n";
          goto LAB_0040a46e;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  if (0 < (int)uVar1) {
    uVar16 = 0;
    do {
      pOVar8 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar16];
      if (pOVar8 != (ON_Curve *)0x0) {
        iVar11 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(pOVar8,text_log);
        if ((char)iVar11 == '\0') {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar13 = "ON_Brep.m_C3[%d] is invalid.\n";
          goto LAB_0040a4c5;
        }
        uVar12 = (*((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar16]->super_ON_Geometry).
                   super_ON_Object._vptr_ON_Object[0x18])();
        if (uVar12 != 3) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar13 = "ON_Brep.m_C3[%d]->Dimension() = %d (should be 3).\n";
          goto LAB_0040a46e;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  if (0 < (int)uVar2) {
    uVar16 = 0;
    do {
      pOVar9 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar16];
      if (pOVar9 != (ON_Surface *)0x0) {
        iVar11 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(pOVar9,text_log);
        if ((char)iVar11 == '\0') {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar13 = "ON_Brep.m_S[%d] is invalid.\n";
          goto LAB_0040a4c5;
        }
        uVar12 = (*((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar16]->super_ON_Geometry).
                   super_ON_Object._vptr_ON_Object[0x18])();
        if (uVar12 != 3) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar13 = "ON_Brep.m_S[%d]->Dimension() = %d (should be 3).\n";
LAB_0040a46e:
          ON_TextLog::Print(text_log,pcVar13,uVar16 & 0xffffffff,(ulong)uVar12);
          return false;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar2 != uVar16);
  }
  if (0 < (int)uVar3) {
    lVar14 = 0x34;
    uVar16 = 0;
    do {
      if ((*(int *)((long)&(((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                             super_ON_ClassArray<ON_BrepVertex>.m_a)->super_ON_Point).
                           super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar14) != -1) &&
         (bVar10 = IsValidVertexGeometry(this,(int)uVar16,text_log), !bVar10)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar13 = "ON_Brep.m_V[%d] is invalid.\n";
        goto LAB_0040a4c5;
      }
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0x58;
    } while (uVar3 != uVar16);
  }
  if (0 < (int)uVar4) {
    lVar14 = 0x4c;
    uVar16 = 0;
    do {
      if ((*(int *)((long)&(((ON_CurveProxy *)
                            (&(((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                super_ON_ClassArray<ON_BrepEdge>.m_a)->super_ON_CurveProxy).
                              m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                           super_ON_Object._vptr_ON_Object + lVar14) != -1) &&
         (bVar10 = IsValidEdgeGeometry(this,(int)uVar16,text_log), !bVar10)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar13 = "ON_Brep.m_E[%d] is invalid.\n";
        goto LAB_0040a4c5;
      }
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0x88;
    } while (uVar4 != uVar16);
  }
  if (0 < (int)uVar7) {
    lVar14 = 0x2c;
    uVar16 = 0;
    do {
      if ((*(int *)((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>
                     .m_a)->m_face_uuid).Data4 + lVar14 + -0x5c) != -1) &&
         (bVar10 = IsValidFaceGeometry(this,(int)uVar16,text_log), !bVar10)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar13 = "ON_Brep.m_F[%d] is invalid.\n";
        goto LAB_0040a4c5;
      }
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0xd8;
    } while (uVar7 != uVar16);
  }
  if (0 < (int)uVar5) {
    lVar14 = 0x4c;
    uVar16 = 0;
    do {
      if ((*(int *)((long)&(((ON_CurveProxy *)
                            (&(((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                              m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                           super_ON_Object._vptr_ON_Object + lVar14) != -1) &&
         (bVar10 = IsValidTrimGeometry(this,(int)uVar16,text_log), !bVar10)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar13 = "ON_Brep.m_T[%d] is invalid.\n";
        goto LAB_0040a4c5;
      }
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0xe8;
    } while (uVar5 != uVar16);
  }
  if (0 < (int)uVar6) {
    lVar14 = 0x1c;
    uVar16 = 0;
    do {
      if ((*(int *)((long)&(((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                             super_ON_ClassArray<ON_BrepLoop>.m_a)->super_ON_Geometry).
                           super_ON_Object._vptr_ON_Object + lVar14) != -1) &&
         (bVar10 = IsValidLoopGeometry(this,(int)uVar16,text_log), !bVar10)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar13 = "ON_Brep.m_L[%d] is invalid.\n";
LAB_0040a4c5:
        ON_TextLog::Print(text_log,pcVar13,uVar16 & 0xffffffff);
        return false;
      }
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0x78;
    } while (uVar6 != uVar16);
  }
  return true;
}

Assistant:

bool
ON_Brep::IsValidGeometry( ON_TextLog* text_log ) const
{
  const int curve2d_count = m_C2.Count();
  const int curve3d_count = m_C3.Count();
  const int surface_count = m_S.Count();
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int c2i, c3i, si, vi, ei, fi, ti, li;

  // check 2d curve geometry
  for ( c2i = 0; c2i < curve2d_count; c2i++ ) {
    if ( !m_C2[c2i] )
    {
      continue;
      // nullptr 2d curves are ok if they are not referenced
    }
    if ( !m_C2[c2i]->IsValid(text_log) )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C2[%d] is invalid.\n",c2i);
      return false;
    }
    int c2_dim = m_C2[c2i]->Dimension();
    if ( c2_dim != 2 )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n", c2i, c2_dim );
      return false;
    }
  }

  // check 3d curve geometry
  for ( c3i = 0; c3i < curve3d_count; c3i++ ) {
    if ( !m_C3[c3i] )
    {
      continue;
      // nullptr 3d curves are ok if they are not referenced
    }
    if ( !m_C3[c3i]->IsValid(text_log) )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C3[%d] is invalid.\n",c3i);
      return false;
    }
    int c3_dim = m_C3[c3i]->Dimension();
    if ( c3_dim != 3 )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C3[%d]->Dimension() = %d (should be 3).\n", c3i, c3_dim );
      return false;
    }
  }

  // check 3d surface geometry
  for ( si = 0; si < surface_count; si++ ) {
    if ( !m_S[si] )
    {
      continue;
      // nullptr 3d surfaces are ok if they are not referenced
    }
    if ( !m_S[si]->IsValid(text_log) )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_S[%d] is invalid.\n",si);
      return false;
    }
    int dim = m_S[si]->Dimension();
    if ( dim != 3 )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_S[%d]->Dimension() = %d (should be 3).\n", si, dim );
      return false;
    }
  }

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexGeometry( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeGeometry( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceGeometry( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( m_T[ti].m_trim_index == -1 )
      continue;
    if ( !IsValidTrimGeometry( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    if ( m_L[li].m_loop_index == -1 )
      continue;
    if ( !IsValidLoopGeometry( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}